

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O3

SENode * __thiscall
spvtools::opt::ScalarEvolutionAnalysis::AnalyzePhiInstruction
          (ScalarEvolutionAnalysis *this,Instruction *phi)

{
  IRContext *this_00;
  DefUseManager *this_01;
  mapped_type pSVar1;
  key_type pLVar2;
  pointer ppSVar3;
  bool bVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  int iVar7;
  BasicBlock *pBVar8;
  LoopDescriptor *pLVar9;
  const_iterator cVar10;
  mapped_type *ppSVar11;
  mapped_type *ppLVar12;
  key_type *__k;
  _Head_base<0UL,_spvtools::opt::SENode_*,_false> this_02;
  Instruction *pIVar13;
  SENode *pSVar14;
  undefined4 extraout_var;
  __normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
  __position;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  _func_int **pp_Var15;
  uint uVar16;
  ScalarEvolutionAnalysis *pSVar17;
  IRContext *this_03;
  ScalarEvolutionAnalysis *pSVar18;
  ScalarEvolutionAnalysis *node;
  uint uVar19;
  Loop *loop;
  Instruction *local_68;
  Loop *local_60;
  ScalarEvolutionAnalysis *local_58;
  map<const_spvtools::opt::Instruction_*,_spvtools::opt::SENode_*,_std::less<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>_>_>
  *local_50;
  SENode *local_48;
  map<const_spvtools::opt::Instruction_*,_spvtools::opt::SENode_*,_std::less<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>_>_>
  *local_40;
  _Head_base<0UL,_spvtools::opt::SENode_*,_false> local_38;
  
  uVar16 = (phi->has_result_id_ & 1) + 1;
  if (phi->has_type_id_ == false) {
    uVar16 = (uint)phi->has_result_id_;
  }
  if ((int)((ulong)((long)(phi->operands_).
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(phi->operands_).
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 - uVar16 ==
      4) {
    this_00 = this->context_;
    this_03 = this_00;
    local_68 = phi;
    if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(this_00);
      this_03 = this->context_;
    }
    this_01 = (this_00->def_use_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
    pBVar8 = IRContext::get_instr_block(this_03,phi);
    pLVar9 = IRContext::GetLoopDescriptor(this->context_,pBVar8->function_);
    if (pLVar9 != (LoopDescriptor *)0x0) {
      pIVar13 = (pBVar8->label_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      uVar5 = 0;
      if (pIVar13->has_result_id_ == true) {
        uVar5 = Instruction::GetSingleWordOperand(pIVar13,(uint)pIVar13->has_type_id_);
      }
      local_48 = (SENode *)CONCAT44(local_48._4_4_,uVar5);
      cVar10 = std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(&(pLVar9->basic_block_to_loop_)._M_h,(key_type_conflict *)&local_48);
      if ((((cVar10.
             super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_false>.
             _M_cur == (__node_type *)0x0) ||
           (local_60 = *(Loop **)((long)cVar10.
                                        super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_false>
                                        ._M_cur + 0x10), local_60 == (Loop *)0x0)) ||
          (local_60->loop_latch_ == (BasicBlock *)0x0)) ||
         ((local_60->loop_preheader_ == (BasicBlock *)0x0 || (local_60->loop_header_ != pBVar8)))) {
        pSVar1 = this->cached_cant_compute_;
        ppSVar11 = std::
                   map<const_spvtools::opt::Instruction_*,_spvtools::opt::SENode_*,_std::less<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>_>_>
                   ::operator[](&this->recurrent_node_map_,&local_68);
        *ppSVar11 = pSVar1;
        return pSVar1;
      }
      __k = &local_60;
      ppLVar12 = std::
                 map<const_spvtools::opt::Loop_*,_const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_const_spvtools::opt::Loop_*>_>_>
                 ::operator[](&this->pretend_equal_,__k);
      if (*ppLVar12 != (mapped_type)0x0) {
        __k = std::
              map<const_spvtools::opt::Loop_*,_const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_const_spvtools::opt::Loop_*>_>_>
              ::operator[](&this->pretend_equal_,&local_60);
      }
      pLVar2 = *__k;
      this_02._M_head_impl = (SENode *)operator_new(0x48);
      *(undefined8 *)
       &(((ScalarEvolutionAnalysis *)this_02._M_head_impl)->recurrent_node_map_)._M_t._M_impl = 0;
      *(pointer *)
       &(((ScalarEvolutionAnalysis *)this_02._M_head_impl)->recurrent_node_map_)._M_t._M_impl.
        super__Rb_tree_header._M_header = (pointer)0x0;
      (((ScalarEvolutionAnalysis *)this_02._M_head_impl)->recurrent_node_map_)._M_t._M_impl.
      super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (((ScalarEvolutionAnalysis *)this_02._M_head_impl)->recurrent_node_map_)._M_t._M_impl.
      super__Rb_tree_header._M_header._M_left = (_Base_ptr)this;
      SENode::NumberOfNodes = SENode::NumberOfNodes + 1;
      *(int *)&(((ScalarEvolutionAnalysis *)this_02._M_head_impl)->recurrent_node_map_)._M_t._M_impl
               .super__Rb_tree_header._M_header._M_right = SENode::NumberOfNodes;
      ((SENode *)&((ScalarEvolutionAnalysis *)this_02._M_head_impl)->context_)->_vptr_SENode =
           (_func_int **)&PTR_GetType_00b0c190;
      (((ScalarEvolutionAnalysis *)this_02._M_head_impl)->node_cache_)._M_h._M_buckets =
           (__buckets_ptr)pLVar2;
      local_50 = &this->recurrent_node_map_;
      ppSVar11 = std::
                 map<const_spvtools::opt::Instruction_*,_spvtools::opt::SENode_*,_std::less<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>_>_>
                 ::operator[](local_50,&local_68);
      *ppSVar11 = this_02._M_head_impl;
      uVar16 = (local_68->has_result_id_ & 1) + 1;
      if (local_68->has_type_id_ == false) {
        uVar16 = (uint)local_68->has_result_id_;
      }
      if (uVar16 != (int)((ulong)((long)(local_68->operands_).
                                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(local_68->operands_).
                                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                    -0x55555555) {
        local_40 = &((ScalarEvolutionAnalysis *)this_02._M_head_impl)->recurrent_node_map_;
        uVar19 = 0;
        do {
          uVar5 = Instruction::GetSingleWordOperand(local_68,uVar16 + uVar19);
          uVar16 = (local_68->has_result_id_ & 1) + 1;
          if (local_68->has_type_id_ == false) {
            uVar16 = (uint)local_68->has_result_id_;
          }
          uVar6 = Instruction::GetSingleWordOperand(local_68,uVar16 + uVar19 + 1);
          pIVar13 = analysis::DefUseManager::GetDef(this_01,uVar5);
          pSVar14 = AnalyzeInstruction(this,pIVar13);
          iVar7 = (**pSVar14->_vptr_SENode)(pSVar14);
          if (iVar7 == 6) goto LAB_005c4f38;
          pIVar13 = (local_60->loop_preheader_->label_)._M_t.
                    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
          uVar5 = 0;
          if (pIVar13->has_result_id_ == true) {
            uVar5 = Instruction::GetSingleWordOperand(pIVar13,(uint)pIVar13->has_type_id_);
          }
          if (uVar6 == uVar5) {
            ((ScalarEvolutionAnalysis *)this_02._M_head_impl)->cached_cant_compute_ = pSVar14;
            local_48 = pSVar14;
            iVar7 = (*((SENode *)&((ScalarEvolutionAnalysis *)this_02._M_head_impl)->context_)->
                      _vptr_SENode[4])(this_02._M_head_impl);
            if (CONCAT44(extraout_var,iVar7) != 0) {
              __assert_fail("false && \"Trying to add a child node to a constant!\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_analysis_nodes.h"
                            ,0x43,"virtual void spvtools::opt::SENode::AddChild(SENode *)");
            }
            __position = std::
                         __find_if<__gnu_cxx::__normal_iterator<spvtools::opt::SENode**,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>,__gnu_cxx::__ops::_Iter_negate<spvtools::opt::SENode::AddChild(spvtools::opt::SENode*)::_lambda(spvtools::opt::SENode_const*)_1_>>
                                   (*(undefined8 *)
                                     &(((ScalarEvolutionAnalysis *)this_02._M_head_impl)->
                                      recurrent_node_map_)._M_t._M_impl,
                                    *(pointer *)
                                     &(((ScalarEvolutionAnalysis *)this_02._M_head_impl)->
                                      recurrent_node_map_)._M_t._M_impl.super__Rb_tree_header.
                                      _M_header,pSVar14);
            std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::insert
                      ((vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_> *)
                       local_40,(const_iterator)__position._M_current,&local_48);
          }
          else {
            pIVar13 = (local_60->loop_latch_->label_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
            uVar5 = 0;
            if (pIVar13->has_result_id_ == true) {
              uVar5 = Instruction::GetSingleWordOperand(pIVar13,(uint)pIVar13->has_type_id_);
            }
            if (uVar6 == uVar5) {
              iVar7 = (**pSVar14->_vptr_SENode)(pSVar14);
              if (iVar7 == 2) {
                ppSVar3 = (pSVar14->children_).
                          super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pSVar17 = (ScalarEvolutionAnalysis *)*ppSVar3;
                local_58 = (ScalarEvolutionAnalysis *)ppSVar3[1];
                iVar7 = (*((SENode *)&pSVar17->context_)->_vptr_SENode[6])(pSVar17);
                pSVar18 = local_58;
                node = pSVar17;
                if ((CONCAT44(extraout_var_00,iVar7) != 0) &&
                   (iVar7 = (*((SENode *)&local_58->context_)->_vptr_SENode[6])(local_58),
                   node = pSVar18, CONCAT44(extraout_var_01,iVar7) != 0)) {
                  node = (ScalarEvolutionAnalysis *)0x0;
                }
                pSVar18 = pSVar17;
                iVar7 = (*((SENode *)&pSVar17->context_)->_vptr_SENode[6])();
                if (CONCAT44(extraout_var_02,iVar7) == 0) {
                  pSVar18 = local_58;
                  iVar7 = (*((SENode *)&local_58->context_)->_vptr_SENode[6])();
                  pSVar17 = (ScalarEvolutionAnalysis *)CONCAT44(extraout_var_03,iVar7);
                  if ((ScalarEvolutionAnalysis *)CONCAT44(extraout_var_03,iVar7) !=
                      (ScalarEvolutionAnalysis *)0x0) {
                    pSVar17 = local_58;
                  }
                }
                if (((node != (ScalarEvolutionAnalysis *)0x0) &&
                    (pSVar17 == (ScalarEvolutionAnalysis *)this_02._M_head_impl)) &&
                   (bVar4 = IsLoopInvariant(pSVar18,local_60,(SENode *)node), bVar4)) {
                  SERecurrentNode::AddCoefficient
                            ((SERecurrentNode *)this_02._M_head_impl,(SENode *)node);
                  goto LAB_005c4ec8;
                }
              }
LAB_005c4f38:
              pSVar14 = this->cached_cant_compute_;
              ppSVar11 = std::
                         map<const_spvtools::opt::Instruction_*,_spvtools::opt::SENode_*,_std::less<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>_>_>
                         ::operator[](local_50,&local_68);
              *ppSVar11 = pSVar14;
              pp_Var15 = ((SENode *)&((ScalarEvolutionAnalysis *)this_02._M_head_impl)->context_)->
                         _vptr_SENode;
              goto LAB_005c4f52;
            }
          }
LAB_005c4ec8:
          uVar19 = uVar19 + 2;
          uVar16 = (local_68->has_result_id_ & 1) + 1;
          if (local_68->has_type_id_ == false) {
            uVar16 = (uint)local_68->has_result_id_;
          }
        } while (uVar19 < (int)((ulong)((long)(local_68->operands_).
                                              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(local_68->operands_).
                                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                          -0x55555555 - uVar16);
      }
      local_38._M_head_impl = this_02._M_head_impl;
      pSVar14 = GetCachedOrAdd(this,(unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                                     *)&local_38);
      ppSVar11 = std::
                 map<const_spvtools::opt::Instruction_*,_spvtools::opt::SENode_*,_std::less<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>_>_>
                 ::operator[](local_50,&local_68);
      *ppSVar11 = pSVar14;
      if ((ScalarEvolutionAnalysis *)local_38._M_head_impl == (ScalarEvolutionAnalysis *)0x0) {
        return pSVar14;
      }
      pp_Var15 = ((SENode *)&(local_38._M_head_impl)->_vptr_SENode)->_vptr_SENode;
      this_02._M_head_impl = local_38._M_head_impl;
LAB_005c4f52:
      (*pp_Var15[2])(this_02._M_head_impl);
      return pSVar14;
    }
  }
  return this->cached_cant_compute_;
}

Assistant:

SENode* ScalarEvolutionAnalysis::AnalyzePhiInstruction(const Instruction* phi) {
  // The phi should only have two incoming value pairs.
  if (phi->NumInOperands() != 4) {
    return CreateCantComputeNode();
  }

  analysis::DefUseManager* def_use = context_->get_def_use_mgr();

  // Get the basic block this instruction belongs to.
  BasicBlock* basic_block =
      context_->get_instr_block(const_cast<Instruction*>(phi));

  // And then the function that the basic blocks belongs to.
  Function* function = basic_block->GetParent();

  // Use the function to get the loop descriptor.
  LoopDescriptor* loop_descriptor = context_->GetLoopDescriptor(function);

  // We only handle phis in loops at the moment.
  if (!loop_descriptor) return CreateCantComputeNode();

  // Get the innermost loop which this block belongs to.
  Loop* loop = (*loop_descriptor)[basic_block->id()];

  // If the loop doesn't exist or doesn't have a preheader or latch block, exit
  // out.
  if (!loop || !loop->GetLatchBlock() || !loop->GetPreHeaderBlock() ||
      loop->GetHeaderBlock() != basic_block)
    return recurrent_node_map_[phi] = CreateCantComputeNode();

  const Loop* loop_to_use = nullptr;
  if (pretend_equal_[loop]) {
    loop_to_use = pretend_equal_[loop];
  } else {
    loop_to_use = loop;
  }
  std::unique_ptr<SERecurrentNode> phi_node{
      new SERecurrentNode(this, loop_to_use)};

  // We add the node to this map to allow it to be returned before the node is
  // fully built. This is needed as the subsequent call to AnalyzeInstruction
  // could lead back to this |phi| instruction so we return the pointer
  // immediately in AnalyzeInstruction to break the recursion.
  recurrent_node_map_[phi] = phi_node.get();

  // Traverse the operands of the instruction an create new nodes for each one.
  for (uint32_t i = 0; i < phi->NumInOperands(); i += 2) {
    uint32_t value_id = phi->GetSingleWordInOperand(i);
    uint32_t incoming_label_id = phi->GetSingleWordInOperand(i + 1);

    Instruction* value_inst = def_use->GetDef(value_id);
    SENode* value_node = AnalyzeInstruction(value_inst);

    // If any operand is CantCompute then the whole graph is CantCompute.
    if (value_node->IsCantCompute())
      return recurrent_node_map_[phi] = CreateCantComputeNode();

    // If the value is coming from the preheader block then the value is the
    // initial value of the phi.
    if (incoming_label_id == loop->GetPreHeaderBlock()->id()) {
      phi_node->AddOffset(value_node);
    } else if (incoming_label_id == loop->GetLatchBlock()->id()) {
      // Assumed to be in the form of step + phi.
      if (value_node->GetType() != SENode::Add)
        return recurrent_node_map_[phi] = CreateCantComputeNode();

      SENode* step_node = nullptr;
      SENode* phi_operand = nullptr;
      SENode* operand_1 = value_node->GetChild(0);
      SENode* operand_2 = value_node->GetChild(1);

      // Find which node is the step term.
      if (!operand_1->AsSERecurrentNode())
        step_node = operand_1;
      else if (!operand_2->AsSERecurrentNode())
        step_node = operand_2;

      // Find which node is the recurrent expression.
      if (operand_1->AsSERecurrentNode())
        phi_operand = operand_1;
      else if (operand_2->AsSERecurrentNode())
        phi_operand = operand_2;

      // If it is not in the form step + phi exit out.
      if (!(step_node && phi_operand))
        return recurrent_node_map_[phi] = CreateCantComputeNode();

      // If the phi operand is not the same phi node exit out.
      if (phi_operand != phi_node.get())
        return recurrent_node_map_[phi] = CreateCantComputeNode();

      if (!IsLoopInvariant(loop, step_node))
        return recurrent_node_map_[phi] = CreateCantComputeNode();

      phi_node->AddCoefficient(step_node);
    }
  }

  // Once the node is fully built we update the map with the version from the
  // cache (if it has already been added to the cache).
  return recurrent_node_map_[phi] = GetCachedOrAdd(std::move(phi_node));
}